

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall Variable_hasInterfaceType_Test::TestBody(Variable_hasInterfaceType_Test *this)

{
  byte bVar1;
  AssertHelper local_60 [8];
  Message local_58 [8];
  char *local_50 [4];
  AssertionResult gtest_ar_;
  VariablePtr v1;
  
  libcellml::Variable::create();
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ =
       (bool)libcellml::Variable::hasInterfaceType
                       ((InterfaceType)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b5,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Variable::hasInterfaceType
                    ((InterfaceType)
                     v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b8,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::Variable::hasInterfaceType
                       ((InterfaceType)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1b9,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Variable::hasInterfaceType
                    ((InterfaceType)
                     v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1bc,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::Variable::hasInterfaceType
                       ((InterfaceType)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1bd,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Variable::hasInterfaceType
                    ((InterfaceType)
                     v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c0,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::Variable::hasInterfaceType
                       ((InterfaceType)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c1,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Variable::removeInterfaceType();
  bVar1 = libcellml::Variable::hasInterfaceType
                    ((InterfaceType)
                     v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE)","true"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c4,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::Variable::hasInterfaceType
                       ((InterfaceType)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,
               "v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1c5,local_50[0]);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, hasInterfaceType)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::NONE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));

    v1->removeInterfaceType();
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
}